

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O1

uint aom_highbd_10_obmc_variance64x16_sse4_1
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar12 [16];
  int iVar16;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar23 [16];
  
  lVar5 = (long)pre * 2;
  auVar10 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar9 = (undefined1  [16])0x0;
  uVar4 = 8;
  auVar8 = (undefined1  [16])0x0;
  do {
    auVar22 = pmovzxwd(in_XMM5,*(undefined8 *)(lVar5 + -8 + uVar4 * 2));
    piVar1 = wsrc + (uVar4 - 8);
    piVar2 = wsrc + (uVar4 - 4);
    auVar23 = pmovzxwd(in_XMM6,*(undefined8 *)(lVar5 + -0x10 + uVar4 * 2));
    in_XMM6 = pmaddwd(auVar23,*(undefined1 (*) [16])(mask + (uVar4 - 8)));
    iVar16 = *piVar1 - in_XMM6._0_4_;
    iVar19 = piVar1[1] - in_XMM6._4_4_;
    iVar20 = piVar1[2] - in_XMM6._8_4_;
    iVar21 = piVar1[3] - in_XMM6._12_4_;
    auVar22 = pmaddwd(auVar22,*(undefined1 (*) [16])(mask + (uVar4 - 4)));
    iVar11 = *piVar2 - auVar22._0_4_;
    iVar13 = piVar2[1] - auVar22._4_4_;
    iVar14 = piVar2[2] - auVar22._8_4_;
    iVar15 = piVar2[3] - auVar22._12_4_;
    auVar17._0_4_ = iVar16 + auVar10._0_4_ + (iVar16 >> 0x1f) >> 0xc;
    auVar17._4_4_ = iVar19 + auVar10._4_4_ + (iVar19 >> 0x1f) >> 0xc;
    auVar17._8_4_ = iVar20 + auVar10._8_4_ + (iVar20 >> 0x1f) >> 0xc;
    auVar17._12_4_ = iVar21 + auVar10._12_4_ + (iVar21 >> 0x1f) >> 0xc;
    in_XMM5._0_4_ = iVar11 >> 0x1f;
    in_XMM5._4_4_ = iVar13 >> 0x1f;
    in_XMM5._8_4_ = iVar14 >> 0x1f;
    in_XMM5._12_4_ = iVar15 >> 0x1f;
    auVar23._0_4_ = iVar11 + auVar10._0_4_ + in_XMM5._0_4_ >> 0xc;
    auVar23._4_4_ = iVar13 + auVar10._4_4_ + in_XMM5._4_4_ >> 0xc;
    auVar23._8_4_ = iVar14 + auVar10._8_4_ + in_XMM5._8_4_ >> 0xc;
    auVar23._12_4_ = iVar15 + auVar10._12_4_ + in_XMM5._12_4_ >> 0xc;
    iVar16 = auVar9._8_4_;
    iVar19 = auVar9._12_4_;
    auVar22 = packssdw(auVar17,auVar23);
    auVar18 = pmaddwd(auVar22,auVar22);
    iVar11 = auVar8._0_4_ + auVar18._0_4_;
    iVar13 = auVar8._4_4_ + auVar18._4_4_;
    auVar22._0_8_ = CONCAT44(iVar13,iVar11);
    auVar22._8_4_ = auVar8._8_4_ + auVar18._8_4_;
    auVar22._12_4_ = auVar8._12_4_ + auVar18._12_4_;
    iVar14 = auVar9._0_4_ + auVar17._0_4_ + auVar23._0_4_;
    iVar15 = auVar9._4_4_ + auVar17._4_4_ + auVar23._4_4_;
    auVar9._0_8_ = CONCAT44(iVar15,iVar14);
    auVar9._8_4_ = iVar16 + auVar17._8_4_ + auVar23._8_4_;
    auVar9._12_4_ = iVar19 + auVar17._12_4_ + auVar23._12_4_;
    lVar7 = 0;
    if ((uVar4 & 0x38) == 0) {
      lVar7 = (long)(pre_stride + -0x40);
    }
    lVar5 = lVar5 + lVar7 * 2;
    uVar6 = uVar4 - 8;
    uVar4 = uVar4 + 8;
    auVar8 = auVar22;
  } while (uVar6 < 0x3f8);
  auVar12._8_4_ = iVar15;
  auVar12._0_8_ = auVar9._0_8_;
  auVar12._12_4_ = iVar15 >> 0x1f;
  auVar10._0_8_ = (long)auVar9._8_4_;
  auVar10._8_4_ = auVar9._12_4_;
  auVar10._12_4_ = auVar9._12_4_ >> 0x1f;
  auVar18._8_4_ = iVar13;
  auVar18._0_8_ = auVar22._0_8_;
  auVar18._12_4_ = iVar13 >> 0x1f;
  auVar8._0_8_ = (long)auVar22._8_4_;
  auVar8._8_4_ = auVar22._12_4_;
  auVar8._12_4_ = auVar22._12_4_ >> 0x1f;
  uVar4 = auVar8._8_8_ + auVar18._8_8_ + auVar8._0_8_ + iVar11 + 8U >> 4;
  *sse = (uint)uVar4;
  lVar5 = (auVar10._8_8_ + auVar12._8_8_ + auVar10._0_8_ + iVar14) * 0x40000000 + 0x80000000 >> 0x20
  ;
  lVar5 = (uVar4 & 0xffffffff) - ((ulong)(lVar5 * lVar5) >> 10);
  uVar3 = (uint)lVar5;
  if (lVar5 < 0) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static inline void hbd_obmc_variance_w8n(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, uint64_t *const sse, int64_t *const sum, const int w,
    const int h) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - w;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(w >= 8);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p1_w = xx_loadl_64(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_w = xx_loadl_64(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu16_epi32(v_p0_w);
    const __m128i v_p1_d = _mm_cvtepu16_epi32(v_p1_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);

    const __m128i v_rdiff0_d = xx_roundn_epi32(v_diff0_d, 12);
    const __m128i v_rdiff1_d = xx_roundn_epi32(v_diff1_d, 12);
    const __m128i v_rdiff01_w = _mm_packs_epi32(v_rdiff0_d, v_rdiff1_d);
    const __m128i v_sqrdiff_d = _mm_madd_epi16(v_rdiff01_w, v_rdiff01_w);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff0_d);
    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff1_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 8;

    if (n % w == 0) pre += pre_step;
  } while (n < w * h);

  *sum += xx_hsum_epi32_si64(v_sum_d);
  *sse += xx_hsum_epi32_si64(v_sse_d);
}